

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateActivationParams(Result *__return_storage_ptr__,ActivationParams *params)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  uint uVar8;
  char cVar9;
  int numFilledIn;
  WeightParamType WVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  char cVar14;
  byte bVar15;
  char cVar16;
  WeightParams *pWVar17;
  uint uVar18;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar18 = params->_oneof_case_[0] - 10;
  uVar13 = (ulong)uVar18;
  if (uVar18 < 0x3e) {
    if ((0x10040100c0300421U >> (uVar13 & 0x3f) & 1) != 0) goto LAB_0054cad1;
    if (uVar13 == 0xf) {
      pWVar17 = ((params->NonlinearityType_).prelu_)->alpha_;
      if (pWVar17 == (WeightParams *)0x0) {
        pWVar17 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      uVar18 = (uint)(0 < (pWVar17->floatvalue_).current_size_);
      uVar8 = uVar18 + 1;
      if (((pWVar17->float16value_).ptr_)->_M_string_length == 0) {
        uVar8 = uVar18;
      }
      if (1 < ((uVar8 - (((pWVar17->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
              (uint)(((pWVar17->int8rawvalue_).ptr_)->_M_string_length == 0)) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Nonlinearity type ",0x12);
        pcVar11 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,sVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8," has inconsistent weight parameter types.",0x29);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d8);
        goto LAB_0054cec5;
      }
      goto LAB_0054cad1;
    }
    if (uVar13 == 0x3d) {
      pWVar17 = ((params->NonlinearityType_).parametricsoftplus_)->alpha_;
      if (pWVar17 == (WeightParams *)0x0) {
        pWVar17 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar1 = (pWVar17->floatvalue_).current_size_;
      cVar9 = 0 < iVar1;
      sVar2 = ((pWVar17->float16value_).ptr_)->_M_string_length;
      cVar14 = cVar9;
      if (sVar2 != 0) {
        cVar14 = cVar9 + '\x01';
      }
      sVar3 = ((pWVar17->rawvalue_).ptr_)->_M_string_length;
      sVar4 = ((pWVar17->int8rawvalue_).ptr_)->_M_string_length;
      bVar15 = cVar14 + (sVar3 != 0) + (sVar4 != 0);
      cVar14 = '\x04';
      if (bVar15 < 2) {
        cVar14 = '\x05';
        if (bVar15 != 0) {
          cVar14 = iVar1 < 1;
        }
        if (((((sVar2 == 0) && (iVar1 < 1)) && (bVar15 != 0)) &&
            (((sVar3 == 0 ||
              (pWVar17 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar14 = '\x02', pWVar17->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar4 == 0 ||
             (pWVar17 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (cVar14 = '\x03', pWVar17->quantization_ == (QuantizationParams *)0x0)))) {
          cVar14 = '\x05';
        }
      }
      pWVar17 = ((params->NonlinearityType_).parametricsoftplus_)->beta_;
      if (pWVar17 == (WeightParams *)0x0) {
        pWVar17 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar1 = (pWVar17->floatvalue_).current_size_;
      sVar5 = ((pWVar17->float16value_).ptr_)->_M_string_length;
      uVar18 = (0 < iVar1) + 1;
      if (sVar5 == 0) {
        uVar18 = (uint)(0 < iVar1);
      }
      sVar6 = ((pWVar17->rawvalue_).ptr_)->_M_string_length;
      sVar7 = ((pWVar17->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar7 == 0);
      uVar18 = (uVar18 - (sVar6 == 0)) + 2;
      cVar16 = '\x04';
      if (uVar18 - uVar8 < 2) {
        cVar16 = '\x05';
        if (uVar18 != uVar8) {
          cVar16 = iVar1 < 1;
        }
        if ((((sVar5 == 0) && (iVar1 < 1)) && (uVar18 != uVar8)) &&
           ((((sVar6 == 0 ||
              (pWVar17 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar16 = '\x02', pWVar17->quantization_ == (QuantizationParams *)0x0)) &&
            (((sVar7 == 0 ||
              (pWVar17 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar16 = '\x03', pWVar17->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar16 = '\x05';
        }
      }
      if (cVar14 == cVar16) {
        if (sVar2 != 0) {
          cVar9 = cVar9 + '\x01';
        }
        if (((byte)(cVar9 + (sVar3 != 0) + (sVar4 != 0)) < 2) &&
           (WVar10 = valueType(pWVar17), WVar10 != UNSPECIFIED)) goto LAB_0054cad1;
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Nonlinearity type ",0x12);
      pcVar11 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
      sVar12 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,sVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8," has inconsistent weight parameter types.",0x29);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d8);
      goto LAB_0054cec5;
    }
  }
  if (params->_oneof_case_[0] != 5) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Nonlinearity type ",0x12);
    pcVar11 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8," is not supported in this version of CoreML.",0x2c);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d8);
LAB_0054cec5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return __return_storage_ptr__;
  }
LAB_0054cad1:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for non-recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLeakyReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kELU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftplus:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kPReLU:
        {
            if (valueType(params.prelu().alpha()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus:
        {
            if (valueType(params.parametricsoftplus().alpha()) != valueType(params.parametricsoftplus().beta()) ||
                valueType(params.parametricsoftplus().alpha()) == UNSPECIFIED ||
                valueType(params.parametricsoftplus().beta()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kThresholdedReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftsign:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Nonlinearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}